

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

void destroy_cgreen_vector(CgreenVector *vector)

{
  int *in_RDI;
  int i;
  int local_c;
  
  if (*(long *)(in_RDI + 2) != 0) {
    for (local_c = 0; local_c < *in_RDI; local_c = local_c + 1) {
      (**(code **)(in_RDI + 2))(*(undefined8 *)(*(long *)(in_RDI + 6) + (long)local_c * 8));
    }
  }
  free(*(void **)(in_RDI + 6));
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  *in_RDI = 0;
  in_RDI[4] = 0;
  free(in_RDI);
  return;
}

Assistant:

void destroy_cgreen_vector(CgreenVector *vector) {
    int i;
    if (vector->destructor != NULL) {
        for (i = 0; i < vector->size; i++) {
            (*vector->destructor)(vector->items[i]);
        }
    }

    free(vector->items);
    vector->items = NULL;
    vector->destructor = NULL;
    vector->size = 0;
    vector->space = 0;

    free(vector);
}